

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

uint16_t __thiscall BaseSocketImpl::GetSocketPort(BaseSocketImpl *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *__serv;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8 [8];
  string servInfoPeer;
  allocator<char> local_c1;
  string local_c0 [8];
  string caAddrPeer;
  undefined1 local_98 [4];
  socklen_t addLen;
  sockaddr_storage addrPe;
  BaseSocketImpl *this_local;
  
  caAddrPeer.field_2._12_4_ = 0x80;
  addrPe.__ss_align = (unsigned_long)this;
  iVar1 = getsockname(this->m_fSock,(sockaddr *)local_98,
                      (socklen_t *)(caAddrPeer.field_2._M_local_buf + 0xc));
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,0x2f,'\0',&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f8,0x20,'\0',&local_f9);
    std::allocator<char>::~allocator(&local_f9);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_c0);
    __serv = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
    iVar1 = getnameinfo((sockaddr *)local_98,0x80,pcVar3,0x2e,__serv,0x20,3);
    if (iVar1 == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar3,&local_121);
      iVar2 = std::__cxx11::stoi(&local_120,(size_t *)0x0,10);
      this_local._6_2_ = (uint16_t)iVar2;
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_c0);
    if (iVar1 == 0) {
      return this_local._6_2_;
    }
  }
  return 0;
}

Assistant:

uint16_t BaseSocketImpl::GetSocketPort()
{
    struct sockaddr_storage addrPe;
    socklen_t addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) == 0)  // Get our IP where the connection was established
    {
        string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
        string servInfoPeer(NI_MAXSERV, 0);
        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
        {
            return static_cast<uint16_t>(stoi(&servInfoPeer[0]));
        }
    }

    return 0;
}